

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase326::run(TestCase326 *this)

{
  int iVar1;
  undefined1 local_71;
  WaitScope waitScope;
  PromiseFulfillerPair<void> pair;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  newPromiseAndFulfiller<void>();
  iVar1 = (*(pair.fulfiller.ptr)->_vptr_PromiseFulfiller[2])();
  if ((char)iVar1 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x14c,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
  }
  (**(pair.fulfiller.ptr)->_vptr_PromiseFulfiller)(pair.fulfiller.ptr,&local_71);
  iVar1 = (*(pair.fulfiller.ptr)->_vptr_PromiseFulfiller[2])();
  if (((byte)iVar1 & _::Debug::minSeverity < 3) != 0) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x14e,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
               (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
  }
  Promise<void>::wait(&pair.promise,&waitScope);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&pair);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}